

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minefield.cpp
# Opt level: O1

void __thiscall Minefield::checkRunning(Minefield *this)

{
  runtime_error *this_00;
  
  if ((this->opened_mine == false) &&
     (this->given_mine_count < this->given_y_dimension * this->given_x_dimension - this->open_cnt))
  {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Game is not running anymore.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool Minefield::isGameRunning() {
    // two requirements
    // 1. no mines have been opened
    // 2. there is a field to be opened that is not a mine
    
    // no mine opened
    if (opened_mine) {
        return false;
    }

    // an open field w/o mine exists
    // -> more fields to open than mines remaining
    return ((getXDimension() * getYDimension()) - open_cnt) > given_mine_count;
    for (int x = 0; x < getXDimension(); x++) {
        for (int y = 0; y < getYDimension(); y++) {
            if((! mines[x][y]) && (! isOpen(x, y))) {
                return true;
            }
         }
    }

    // requirements not met
    return false;
}